

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsResub.c
# Opt level: O1

int Abc_NtkMfsEdgePower(Mfs_Man_t *p,Abc_Obj_t *pNode)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  void *pvVar3;
  int iVar4;
  long lVar5;
  
  if (0 < (pNode->vFanins).nSize) {
    lVar5 = 0;
    do {
      pVVar2 = p->vProbs;
      if (pVVar2 != (Vec_Int_t *)0x0) {
        pvVar3 = pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar5]];
        uVar1 = *(uint *)((long)pvVar3 + 0x10);
        if ((int)uVar1 < pVVar2->nSize) {
          if ((int)uVar1 < 0) goto LAB_00465ce6;
          if (0.35 <= (float)pVVar2->pArray[uVar1]) {
            iVar4 = Abc_NtkMfsSolveSatResub(p,pNode,(int)lVar5,0,0);
            if (iVar4 != 0) {
              return 1;
            }
            goto LAB_00465cc0;
          }
        }
        if (pVVar2 != (Vec_Int_t *)0x0) {
          uVar1 = *(uint *)((long)pvVar3 + 0x10);
          if ((int)uVar1 < pVVar2->nSize) {
            if ((int)uVar1 < 0) {
LAB_00465ce6:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            if ((0.25 <= (float)pVVar2->pArray[uVar1]) &&
               (iVar4 = Abc_NtkMfsSolveSatResub(p,pNode,(int)lVar5,1,0), iVar4 != 0)) {
              return 1;
            }
          }
        }
      }
LAB_00465cc0:
      lVar5 = lVar5 + 1;
    } while (lVar5 < (pNode->vFanins).nSize);
  }
  return 0;
}

Assistant:

int Abc_NtkMfsEdgePower( Mfs_Man_t * p, Abc_Obj_t * pNode )
{
    Abc_Obj_t * pFanin;
    int i;
    // try replacing area critical fanins
    Abc_ObjForEachFanin( pNode, pFanin, i )
	{
        if ( Abc_MfsObjProb(p, pFanin) >= 0.35 )
        {
            if ( Abc_NtkMfsSolveSatResub( p, pNode, i, 0, 0 ) )
                return 1;
        } else if ( Abc_MfsObjProb(p, pFanin) >= 0.25 ) // sjang
        {
            if ( Abc_NtkMfsSolveSatResub( p, pNode, i, 1, 0 ) )
                return 1;
        }
        }
    return 0;
}